

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t pls_format_to_components(PlsFormat format)

{
  uint32_t local_c;
  PlsFormat format_local;
  
  switch(format) {
  case PlsR11FG11FB10F:
    local_c = 3;
    break;
  default:
    local_c = 1;
    break;
  case PlsRG16F:
  case PlsRG16:
  case PlsRG16I:
  case PlsRG16UI:
    local_c = 2;
    break;
  case PlsRGB10A2:
  case PlsRGBA8:
  case PlsRGBA8I:
  case PlsRGB10A2UI:
  case PlsRGBA8UI:
    local_c = 4;
  }
  return local_c;
}

Assistant:

static uint32_t pls_format_to_components(PlsFormat format)
{
	switch (format)
	{
	default:
	case PlsR32F:
	case PlsR32UI:
		return 1;

	case PlsRG16F:
	case PlsRG16:
	case PlsRG16UI:
	case PlsRG16I:
		return 2;

	case PlsR11FG11FB10F:
		return 3;

	case PlsRGB10A2:
	case PlsRGBA8:
	case PlsRGBA8I:
	case PlsRGB10A2UI:
	case PlsRGBA8UI:
		return 4;
	}
}